

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O3

_Fwd_list_const_iterator<int> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::dummy_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> first,_Fwd_list_const_iterator<int> last,
          bitmask_type *hint)

{
  _WordT _Var1;
  uint uVar2;
  const_iterator cVar3;
  __buckets_ptr pp_Var4;
  
  if (first._M_node != last._M_node) {
    pp_Var4 = (__buckets_ptr)0xffffffffffffffff;
    do {
      pp_Var4 = (__buckets_ptr)((long)pp_Var4 + 1);
      if ((*(_Hashtable<int,_std::pair<const_int,_std::bitset<32UL>_>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             **)this)[1]._M_buckets <= pp_Var4) {
        return (_Fwd_list_const_iterator<int>)first._M_node;
      }
      _Var1 = (hint->super__Base_bitset<1UL>)._M_w;
      cVar3 = std::
              _Hashtable<int,_std::pair<const_int,_std::bitset<32UL>_>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(*(_Hashtable<int,_std::pair<const_int,_std::bitset<32UL>_>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       **)this,(key_type_conflict *)(first._M_node + 1));
      if (cVar3.super__Node_iterator_base<std::pair<const_int,_std::bitset<32UL>_>,_false>._M_cur ==
          (__node_type *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)*(undefined8 *)
                       ((long)cVar3.
                              super__Node_iterator_base<std::pair<const_int,_std::bitset<32UL>_>,_false>
                              ._M_cur + 0x10);
      }
      (hint->super__Base_bitset<1UL>)._M_w = (ulong)(uVar2 & (int)_Var1 * 2 + 1U);
      first._M_node = (first._M_node)->_M_next;
    } while (first._M_node != last._M_node);
  }
  return (_Fwd_list_const_iterator<int>)first._M_node;
}

Assistant:

ForwardIterator
                dummy_search
                (
                    ForwardIterator first,
                    ForwardIterator last,
                    bitmask_type & hint
                ) const
            {
                auto dummy_iteration_count = std::size_t{0};
                while (first != last && dummy_iteration_count < m_bitmask_table->length())
                {
                    hint = bit_shift(hint) & (*m_bitmask_table)[*first];

                    ++first;
                    ++dummy_iteration_count;
                }

                return first;
            }